

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lzma2Dec.c
# Opt level: O0

SRes Lzma2Dec_DecodeToDic
               (CLzma2Dec *p,SizeT dicLimit,Byte *src,SizeT *srcLen,ELzmaFinishMode finishMode,
               ELzmaStatus *status)

{
  ELzma2State EVar1;
  uint uVar2;
  uint initDic_00;
  SRes SVar3;
  ELzmaStatus *status_00;
  long lVar4;
  CLzmaDec *in_RCX;
  Byte *pBVar5;
  Byte *in_RDX;
  SizeT in_RSI;
  CLzma2Dec *in_RDI;
  int in_R8D;
  int *in_R9;
  int __result__;
  Bool_conflict initState;
  Bool_conflict initDic_1;
  uint mode;
  SRes res;
  SizeT outSizeProcessed;
  Bool_conflict initDic;
  ELzmaFinishMode curFinishMode;
  SizeT srcSizeCur;
  SizeT destSizeCur;
  SizeT dicPos;
  SizeT inSize;
  Byte *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  ELzmaStatus *local_58;
  SizeT SVar6;
  SizeT *srcLen_00;
  undefined4 in_stack_ffffffffffffffd0;
  Byte *local_20;
  
  srcLen_00 = *(SizeT **)&in_RCX->prop;
  (in_RCX->prop).lc = 0;
  (in_RCX->prop).lp = 0;
  *in_R9 = 0;
  local_20 = in_RDX;
  do {
    while( true ) {
      if (in_RDI->state == 8) {
        *in_R9 = 1;
        return 0;
      }
      SVar6 = (in_RDI->decoder).dicPos;
      if (in_RDI->state == 9) {
        return 1;
      }
      if ((SVar6 == in_RSI) && (in_R8D == 0)) {
        *in_R9 = 2;
        return 0;
      }
      if ((in_RDI->state == 6) || (in_RDI->state == 7)) break;
      if (*(SizeT **)&in_RCX->prop == srcLen_00) {
        *in_R9 = 3;
        return 0;
      }
      *(long *)&in_RCX->prop = *(long *)&in_RCX->prop + 1;
      pBVar5 = local_20 + 1;
      EVar1 = Lzma2Dec_UpdateState(in_RDI,*local_20);
      in_RDI->state = EVar1;
      local_20 = pBVar5;
      if ((SVar6 == in_RSI) && (in_RDI->state != 8)) {
        in_RDI->state = 9;
        return 1;
      }
    }
    status_00 = (ELzmaStatus *)(in_RSI - SVar6);
    local_58 = (ELzmaStatus *)((long)srcLen_00 - *(long *)&in_RCX->prop);
    if ((ELzmaStatus *)(ulong)in_RDI->unpackSize <= status_00) {
      status_00 = (ELzmaStatus *)(ulong)in_RDI->unpackSize;
    }
    if ((in_RDI->control & 0x80) == 0) {
      if (*(SizeT **)&in_RCX->prop == srcLen_00) {
        *in_R9 = 3;
        return 0;
      }
      if (in_RDI->state == 6) {
        uVar2 = (uint)(in_RDI->control == '\x01');
        if (uVar2 == 0) {
          if (in_RDI->needInitDic != 0) {
            in_RDI->state = 9;
            return 1;
          }
        }
        else {
          in_RDI->needInitState = 1;
          in_RDI->needInitProp = 1;
        }
        in_RDI->needInitDic = 0;
        LzmaDec_InitDicAndState(&in_RDI->decoder,uVar2,0);
      }
      if (status_00 < local_58) {
        local_58 = status_00;
      }
      if (local_58 == (ELzmaStatus *)0x0) {
        in_RDI->state = 9;
        return 1;
      }
      LzmaDec_UpdateWithUncompressed
                ((CLzmaDec *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78,0x897f55);
      *(long *)&in_RCX->prop = (long)local_58 + *(long *)&in_RCX->prop;
      in_RDI->unpackSize = in_RDI->unpackSize - (int)local_58;
      uVar2 = 7;
      if (in_RDI->unpackSize == 0) {
        uVar2 = 0;
      }
      in_RDI->state = uVar2;
    }
    else {
      if (in_RDI->state == 6) {
        uVar2 = (int)(uint)in_RDI->control >> 5 & 3;
        initDic_00 = (uint)(uVar2 == 3);
        uVar2 = (uint)(uVar2 != 0);
        if (((initDic_00 == 0) && (in_RDI->needInitDic != 0)) ||
           ((uVar2 == 0 && (in_RDI->needInitState != 0)))) {
          in_RDI->state = 9;
          return 1;
        }
        LzmaDec_InitDicAndState(&in_RDI->decoder,initDic_00,uVar2);
        in_RDI->needInitDic = 0;
        in_RDI->needInitState = 0;
        in_RDI->state = 7;
      }
      if ((ELzmaStatus *)(ulong)in_RDI->packSize < local_58) {
        local_58 = (ELzmaStatus *)(ulong)in_RDI->packSize;
      }
      SVar3 = LzmaDec_DecodeToDic(in_RCX,CONCAT44(in_R8D,in_stack_ffffffffffffffd0),(Byte *)in_R9,
                                  srcLen_00,(ELzmaFinishMode)(SVar6 >> 0x20),status_00);
      *(long *)&in_RCX->prop = (long)local_58 + *(long *)&in_RCX->prop;
      in_RDI->packSize = in_RDI->packSize - (int)local_58;
      lVar4 = (in_RDI->decoder).dicPos - SVar6;
      in_RDI->unpackSize = in_RDI->unpackSize - (int)lVar4;
      if (SVar3 != 0) {
        return SVar3;
      }
      if (*in_R9 == 3) {
        return 0;
      }
      if ((local_58 == (ELzmaStatus *)0x0) && (lVar4 == 0)) {
        if ((*in_R9 != 4) || ((in_RDI->unpackSize != 0 || (in_RDI->packSize != 0)))) {
          in_RDI->state = 9;
          return 1;
        }
        in_RDI->state = 0;
      }
      if (*in_R9 == 4) {
        *in_R9 = 2;
      }
      in_stack_ffffffffffffff84 = 0;
    }
    local_20 = (Byte *)((long)local_58 + (long)local_20);
  } while( true );
}

Assistant:

SRes Lzma2Dec_DecodeToDic(CLzma2Dec *p, SizeT dicLimit,
    const Byte *src, SizeT *srcLen, ELzmaFinishMode finishMode, ELzmaStatus *status)
{
  SizeT inSize = *srcLen;
  *srcLen = 0;
  *status = LZMA_STATUS_NOT_SPECIFIED;

  while (p->state != LZMA2_STATE_FINISHED)
  {
    SizeT dicPos = p->decoder.dicPos;
    
    if (p->state == LZMA2_STATE_ERROR)
      return SZ_ERROR_DATA;
    
    if (dicPos == dicLimit && finishMode == LZMA_FINISH_ANY)
    {
      *status = LZMA_STATUS_NOT_FINISHED;
      return SZ_OK;
    }

    if (p->state != LZMA2_STATE_DATA && p->state != LZMA2_STATE_DATA_CONT)
    {
      if (*srcLen == inSize)
      {
        *status = LZMA_STATUS_NEEDS_MORE_INPUT;
        return SZ_OK;
      }
      (*srcLen)++;
      p->state = Lzma2Dec_UpdateState(p, *src++);

      if (dicPos == dicLimit && p->state != LZMA2_STATE_FINISHED)
      {
        p->state = LZMA2_STATE_ERROR;
        return SZ_ERROR_DATA;
      }
      continue;
    }
    
    {
      SizeT destSizeCur = dicLimit - dicPos;
      SizeT srcSizeCur = inSize - *srcLen;
      ELzmaFinishMode curFinishMode = LZMA_FINISH_ANY;
      
      if (p->unpackSize <= destSizeCur)
      {
        destSizeCur = (SizeT)p->unpackSize;
        curFinishMode = LZMA_FINISH_END;
      }

      if (LZMA2_IS_UNCOMPRESSED_STATE(p))
      {
        if (*srcLen == inSize)
        {
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }

        if (p->state == LZMA2_STATE_DATA)
        {
          Bool initDic = (p->control == LZMA2_CONTROL_COPY_RESET_DIC);
          if (initDic)
            p->needInitProp = p->needInitState = True;
          else if (p->needInitDic)
          {
            p->state = LZMA2_STATE_ERROR;
            return SZ_ERROR_DATA;
          }
          p->needInitDic = False;
          LzmaDec_InitDicAndState(&p->decoder, initDic, False);
        }

        if (srcSizeCur > destSizeCur)
          srcSizeCur = destSizeCur;

        if (srcSizeCur == 0)
        {
          p->state = LZMA2_STATE_ERROR;
          return SZ_ERROR_DATA;
        }

        LzmaDec_UpdateWithUncompressed(&p->decoder, src, srcSizeCur);

        src += srcSizeCur;
        *srcLen += srcSizeCur;
        p->unpackSize -= (UInt32)srcSizeCur;
        p->state = (p->unpackSize == 0) ? LZMA2_STATE_CONTROL : LZMA2_STATE_DATA_CONT;
      }
      else
      {
        SizeT outSizeProcessed;
        SRes res;

        if (p->state == LZMA2_STATE_DATA)
        {
          unsigned mode = LZMA2_GET_LZMA_MODE(p);
          Bool initDic = (mode == 3);
          Bool initState = (mode != 0);
          if ((!initDic && p->needInitDic) || (!initState && p->needInitState))
          {
            p->state = LZMA2_STATE_ERROR;
            return SZ_ERROR_DATA;
          }
          
          LzmaDec_InitDicAndState(&p->decoder, initDic, initState);
          p->needInitDic = False;
          p->needInitState = False;
          p->state = LZMA2_STATE_DATA_CONT;
        }
  
        if (srcSizeCur > p->packSize)
          srcSizeCur = (SizeT)p->packSize;
          
        res = LzmaDec_DecodeToDic(&p->decoder, dicPos + destSizeCur, src, &srcSizeCur, curFinishMode, status);
        
        src += srcSizeCur;
        *srcLen += srcSizeCur;
        p->packSize -= (UInt32)srcSizeCur;

        outSizeProcessed = p->decoder.dicPos - dicPos;
        p->unpackSize -= (UInt32)outSizeProcessed;

        RINOK(res);
        if (*status == LZMA_STATUS_NEEDS_MORE_INPUT)
          return res;

        if (srcSizeCur == 0 && outSizeProcessed == 0)
        {
          if (*status != LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK
              || p->unpackSize != 0
              || p->packSize != 0)
          {
            p->state = LZMA2_STATE_ERROR;
            return SZ_ERROR_DATA;
          }
          p->state = LZMA2_STATE_CONTROL;
        }
        
        if (*status == LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK)
          *status = LZMA_STATUS_NOT_FINISHED;
      }
    }
  }
  
  *status = LZMA_STATUS_FINISHED_WITH_MARK;
  return SZ_OK;
}